

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O2

TestCase *
vkt::createFunctionCaseWithPrograms<unsigned_int>
          (TestContext *testCtx,TestNodeType type,string *name,string *desc,Function initPrograms,
          Function testFunction,uint arg0)

{
  InstanceFactory1<vkt::FunctionInstance1<unsigned_int>,_vkt::FunctionInstance1<unsigned_int>::Args,_vkt::FunctionPrograms1<unsigned_int>_>
  *this;
  FunctionPrograms1<unsigned_int> local_48;
  Args local_40;
  
  this = (InstanceFactory1<vkt::FunctionInstance1<unsigned_int>,_vkt::FunctionInstance1<unsigned_int>::Args,_vkt::FunctionPrograms1<unsigned_int>_>
          *)operator_new(0x88);
  local_40.arg0 = arg0;
  local_48.m_func = initPrograms;
  local_40.func = testFunction;
  InstanceFactory1<vkt::FunctionInstance1<unsigned_int>,_vkt::FunctionInstance1<unsigned_int>::Args,_vkt::FunctionPrograms1<unsigned_int>_>
  ::InstanceFactory1(this,testCtx,type,name,desc,&local_48,&local_40);
  return &this->super_TestCase;
}

Assistant:

TestCase* createFunctionCaseWithPrograms (tcu::TestContext&								testCtx,
										  tcu::TestNodeType								type,
										  const std::string&							name,
										  const std::string&							desc,
										  typename FunctionPrograms1<Arg0>::Function	initPrograms,
										  typename FunctionInstance1<Arg0>::Function	testFunction,
										  Arg0											arg0)
{
	return new InstanceFactory1<FunctionInstance1<Arg0>, typename FunctionInstance1<Arg0>::Args, FunctionPrograms1<Arg0> >(
		testCtx, type, name, desc, FunctionPrograms1<Arg0>(initPrograms), typename FunctionInstance1<Arg0>::Args(testFunction, arg0));
}